

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  ImGuiNextWindowDataFlags IVar2;
  ImDrawList *pIVar3;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id_00;
  ImGuiWindow *this;
  ImGuiCol IVar6;
  ImDrawFlags IVar7;
  byte local_159;
  float local_13c;
  float local_118;
  float local_114;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImRect local_f0 [2];
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImU32 local_c0;
  ImU32 local_bc;
  ImU32 text_col;
  ImU32 bg_col;
  float local_b0;
  ImU32 local_ac;
  float value_x2;
  ImU32 frame_col;
  byte local_9f;
  bool local_9e;
  bool popup_open;
  ImGuiID popup_id;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_94;
  undefined1 local_8c [8];
  ImRect total_bb;
  ImVec2 local_74;
  undefined1 local_6c [8];
  ImRect bb;
  float w;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiNextWindowDataFlags backup_next_window_data_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_20;
  ImGuiComboFlags flags_local;
  char *preview_value_local;
  char *label_local;
  
  pIVar4 = GImGui;
  this = GetCurrentWindow();
  IVar2 = (pIVar4->NextWindowData).Flags;
  ImGuiNextWindowData::ClearFlags(&pIVar4->NextWindowData);
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    if ((flags & 0x60U) == 0x60) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x63a,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    if ((flags & 0x20U) == 0) {
      local_114 = GetFrameHeight();
    }
    else {
      local_114 = 0.0;
    }
    register0x00001200 = CalcTextSize(label,(char *)0x0,true,-1.0);
    if ((flags & 0x40U) == 0) {
      local_118 = CalcItemWidth();
    }
    else {
      local_118 = local_114;
    }
    bb.Max.x = local_118;
    fVar1 = (pIVar4->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,local_118,fVar1 + fVar1 + w);
    local_74 = ::operator+(&(this->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_6c,&(this->DC).CursorPos,&local_74);
    if (bb.Max.y <= 0.0) {
      local_13c = 0.0;
    }
    else {
      local_13c = (pIVar4->Style).ItemInnerSpacing.x + bb.Max.y;
    }
    ImVec2::ImVec2((ImVec2 *)&popup_id,local_13c,0.0);
    local_94 = ::operator+(&bb.Min,(ImVec2 *)&popup_id);
    ImRect::ImRect((ImRect *)local_8c,(ImVec2 *)local_6c,&local_94);
    ItemSize((ImRect *)local_8c,(pIVar4->Style).FramePadding.y);
    bVar5 = ItemAdd((ImRect *)local_8c,id_00,(ImRect *)local_6c,0);
    if (bVar5) {
      local_9f = ButtonBehavior((ImRect *)local_6c,id_00,&popup_open,&local_9e,0);
      frame_col = ImHashStr("##ComboPopup",0,id_00);
      value_x2._3_1_ = IsPopupOpen(frame_col,0);
      if (((local_9f & 1) != 0) && (!(bool)value_x2._3_1_)) {
        OpenPopupEx(frame_col,0);
        value_x2._3_1_ = true;
      }
      IVar6 = 7;
      if ((popup_open & 1U) != 0) {
        IVar6 = 8;
      }
      local_ac = GetColorU32(IVar6,1.0);
      local_b0 = ImMax<float>((float)local_6c._0_4_,bb.Min.x - local_114);
      RenderNavHighlight((ImRect *)local_6c,id_00,1);
      if ((flags & 0x40U) == 0) {
        pIVar3 = this->DrawList;
        ImVec2::ImVec2((ImVec2 *)&text_col,local_b0,bb.Min.y);
        IVar7 = 0x50;
        if ((flags & 0x20U) != 0) {
          IVar7 = 0xf0;
        }
        ImDrawList::AddRectFilled
                  (pIVar3,(ImVec2 *)local_6c,(ImVec2 *)&text_col,local_ac,
                   (pIVar4->Style).FrameRounding,IVar7);
      }
      if ((flags & 0x20U) == 0) {
        local_159 = 1;
        if ((value_x2._3_1_ & 1) == 0) {
          local_159 = popup_open;
        }
        IVar6 = 0x15;
        if ((local_159 & 1) != 0) {
          IVar6 = 0x16;
        }
        local_bc = GetColorU32(IVar6,1.0);
        local_c0 = GetColorU32(0,1.0);
        pIVar3 = this->DrawList;
        ImVec2::ImVec2(&local_c8,local_b0,(float)local_6c._4_4_);
        IVar7 = 0xa0;
        if (bb.Max.x <= local_114) {
          IVar7 = 0xf0;
        }
        ImDrawList::AddRectFilled
                  (pIVar3,&local_c8,&bb.Min,local_bc,(pIVar4->Style).FrameRounding,IVar7);
        if ((local_b0 + local_114) - (pIVar4->Style).FramePadding.x <= bb.Min.x) {
          pIVar3 = this->DrawList;
          fVar1 = (pIVar4->Style).FramePadding.y;
          ImVec2::ImVec2(&local_d0,local_b0 + fVar1,(float)local_6c._4_4_ + fVar1);
          RenderArrow(pIVar3,local_d0,local_c0,3,1.0);
        }
      }
      p_min.y = (float)local_6c._4_4_;
      p_min.x = (float)local_6c._0_4_;
      p_max.y = bb.Min.y;
      p_max.x = bb.Min.x;
      RenderFrameBorder(p_min,p_max,(pIVar4->Style).FrameRounding);
      pcStack_20 = preview_value;
      if ((flags & 0x100000U) != 0) {
        ImRect::ImRect(local_f0,(float)local_6c._0_4_,(float)local_6c._4_4_,local_b0,bb.Min.y);
        (pIVar4->ComboPreviewData).PreviewRect.Min = local_f0[0].Min;
        (pIVar4->ComboPreviewData).PreviewRect.Max = local_f0[0].Max;
        bVar5 = true;
        if (preview_value != (char *)0x0) {
          bVar5 = *preview_value == '\0';
        }
        if (!bVar5) {
          __assert_fail("preview_value == __null || preview_value[0] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                        ,0x664,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)"
                       );
        }
        pcStack_20 = (char *)0x0;
      }
      if ((pcStack_20 != (char *)0x0) && ((flags & 0x40U) == 0)) {
        if ((pIVar4->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        local_f8 = ::operator+((ImVec2 *)local_6c,&(pIVar4->Style).FramePadding);
        ImVec2::ImVec2(&local_100,local_b0,bb.Min.y);
        ImVec2::ImVec2(&local_108,0.0,0.0);
        RenderTextClipped(&local_f8,&local_100,pcStack_20,(char *)0x0,(ImVec2 *)0x0,&local_108,
                          (ImRect *)0x0);
      }
      if (0.0 < bb.Max.y) {
        ImVec2::ImVec2(&local_110,bb.Min.x + (pIVar4->Style).ItemInnerSpacing.x,
                       (float)local_6c._4_4_ + (pIVar4->Style).FramePadding.y);
        RenderText(local_110,label,(char *)0x0,true);
      }
      if ((value_x2._3_1_ & 1) == 0) {
        label_local._7_1_ = false;
      }
      else {
        (pIVar4->NextWindowData).Flags = IVar2;
        label_local._7_1_ = BeginComboPopup(frame_col,(ImRect *)local_6c,flags);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if (pressed && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Custom preview
    if (flags & ImGuiComboFlags_CustomPreview)
    {
        g.ComboPreviewData.PreviewRect = ImRect(bb.Min.x, bb.Min.y, value_x2, bb.Max.y);
        IM_ASSERT(preview_value == NULL || preview_value[0] == 0);
        preview_value = NULL;
    }

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}